

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::SetExceptionBreakpointsRequest>::copyConstruct
          (BasicTypeInfo<dap::SetExceptionBreakpointsRequest> *this,void *dst,void *src)

{
  std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>::vector
            ((vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_> *)dst,
             (vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_> *)src);
  *(undefined1 *)((long)dst + 0x18) = *(undefined1 *)((long)src + 0x18);
  std::vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_>::vector
            ((vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_> *)
             ((long)dst + 0x20),
             (vector<dap::ExceptionFilterOptions,_std::allocator<dap::ExceptionFilterOptions>_> *)
             ((long)src + 0x20));
  *(undefined1 *)((long)dst + 0x38) = *(undefined1 *)((long)src + 0x38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)dst + 0x40),
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)src + 0x40));
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }